

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

int pkey_size_gost(EVP_PKEY *pk)

{
  int iVar1;
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    iVar1 = EVP_PKEY_get_base_id(in_RDI);
    if (((iVar1 - 0x32bU < 2) || (iVar1 == 0x331)) || (iVar1 == 0x3d3)) {
      local_4 = 0x40;
    }
    else if (iVar1 == 0x3d4) {
      local_4 = 0x80;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int pkey_size_gost(const EVP_PKEY *pk)
{
    if (!pk)
        return -1;

    switch (EVP_PKEY_base_id(pk)) {
    case NID_id_GostR3410_94:
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_2012_256:
        return 64;
    case NID_id_GostR3410_2012_512:
        return 128;
    }

    return -1;
}